

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
vkt::shaderexecutor::
createApply<vkt::shaderexecutor::Signature<float,bool,float,float,vkt::shaderexecutor::Void>>
          (shaderexecutor *this,
          Func<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
          *func,ExprP<bool> *arg0,ExprP<float> *arg1,ExprP<float> *arg2,
          ExprP<vkt::shaderexecutor::Void> *arg3)

{
  Apply<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
  *this_00;
  ExprP<float> EVar1;
  ExprP<vkt::shaderexecutor::Void> *arg3_local;
  ExprP<float> *arg2_local;
  ExprP<float> *arg1_local;
  ExprP<bool> *arg0_local;
  Func<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
  *func_local;
  
  this_00 = (Apply<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
             *)operator_new(0x50);
  Apply<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>::
  Apply(this_00,func,arg0,arg1,arg2,arg3);
  EVar1 = exprP<float>(this,(Expr<float> *)this_00);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}